

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_Constructor_type_Test::~AddressFactory_Constructor_type_Test
          (AddressFactory_Constructor_type_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}